

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O1

int append_to_zip(FILE *zip_file,file_sorted_t *filep,FILE *ozip,BYTE *odir)

{
  file_entry_t *pfVar1;
  bool bVar2;
  file_sorted_t *pfVar3;
  uint uVar4;
  int iVar5;
  tm *time;
  FILE *pFVar6;
  ulong uVar7;
  void *__ptr;
  size_t sVar8;
  undefined8 uVar9;
  CentralDirectoryEntry *ent;
  code *pcVar10;
  ulong uVar11;
  long lVar12;
  FILE *pFVar13;
  char *pcVar14;
  uint uVar15;
  uint *puVar16;
  uint comp_len [2];
  Byte *compbuf [2];
  int method [2];
  int offset [2];
  LocalFileHeader local;
  uint auStack_c0 [2];
  undefined1 *local_b8;
  file_sorted_t *local_b0;
  BYTE *local_a8;
  void *local_a0;
  void *local_98;
  FILE *local_90;
  void *local_88 [2];
  ulong local_78;
  file_entry_t *local_70;
  ulong local_68;
  short asStack_60 [4];
  int aiStack_58 [3];
  undefined2 local_4c;
  short local_4a;
  short local_48;
  short local_46;
  short local_44;
  uint local_42;
  uint local_3e;
  uint local_3a;
  undefined2 local_36;
  undefined2 local_34;
  
  pfVar1 = filep->file;
  local_b0 = filep;
  local_a8 = odir;
  local_90 = (FILE *)zip_file;
  time = localtime(&pfVar1->time_write);
  time_to_dos((tm *)time,&pfVar1->date,&pfVar1->time);
  pFVar6 = fopen(&pfVar1->field_0x26,"rb");
  if (pFVar6 == (FILE *)0x0) {
    append_to_zip_cold_1();
  }
  else {
    local_b8 = &pfVar1->field_0x26;
    fseek(pFVar6,0,2);
    uVar7 = ftell(pFVar6);
    fseek(pFVar6,0,0);
    uVar15 = (uint)uVar7;
    uVar11 = uVar7 & 0xffffffff;
    __ptr = malloc(uVar11);
    if (__ptr == (void *)0x0) {
      fclose(pFVar6);
      fprintf(_stderr,"Could not allocate %u bytes\n",uVar7 & 0xffffffff);
    }
    else {
      local_78 = uVar11;
      sVar8 = fread(__ptr,1,uVar11,pFVar6);
      fclose(pFVar6);
      if ((uint)sVar8 == uVar15) {
        pfVar1->uncompressed_size = uVar15;
        pfVar1->compressed_size = uVar15;
        pfVar1->method = 0;
        uVar9 = crc32(0,0,0);
        uVar4 = crc32(uVar9,__ptr,uVar7 & 0xffffffff);
        pfVar1->crc32 = uVar4;
        if (ozip != (FILE *)0x0 && local_a8 != (BYTE *)0x0) {
          ent = find_file_in_zip(local_a8,local_b0->path_in_zip,uVar15,uVar4,0,0);
          bVar2 = true;
          pFVar13 = ozip;
          if (ent != (CentralDirectoryEntry *)0x0) {
            iVar5 = copy_zip_file((FILE *)local_90,pfVar1,ozip,ent);
            if (iVar5 < 1) {
              if (iVar5 < 0) {
                free(__ptr);
                bVar2 = false;
                fprintf(_stderr,"Unable to write %s to zip\n",local_b8);
                pFVar13 = (FILE *)0x1;
              }
            }
            else {
              free(__ptr);
              bVar2 = false;
              pFVar13 = (FILE *)0x0;
            }
          }
          if (!bVar2) {
            return (int)pFVar13;
          }
        }
        local_70 = pfVar1;
        if (Quiet == 0) {
          pcVar14 = "Adding %-40s";
          if (ozip != (FILE *)0x0) {
            pcVar14 = "Updating %-40s";
          }
          printf(pcVar14,local_b0->path_in_zip);
        }
        UpdateCount = UpdateCount + 1;
        uVar11 = (ulong)(uVar15 - 1);
        local_a8 = (BYTE *)uVar7;
        local_a0 = malloc(uVar11);
        local_88[0] = local_a0;
        local_68 = uVar11;
        local_98 = malloc(uVar11);
        local_88[1] = local_98;
        lVar12 = 0;
        uVar4 = 0xffffffff;
        pcVar10 = compress_lzma;
        uVar15 = 0;
        do {
          if ((DeflateOnly == 0) || (*(int *)((long)&Compressors[0].method + lVar12) == 8)) {
            uVar7 = (ulong)uVar15;
            puVar16 = auStack_c0 + uVar7;
            *puVar16 = (uint)local_68;
            *(undefined4 *)(asStack_60 + uVar7 * 2) =
                 *(undefined4 *)((long)&Compressors[0].method + lVar12);
            iVar5 = (*pcVar10)(local_88[uVar7],puVar16,__ptr,local_a8);
            aiStack_58[uVar7] = iVar5;
            if ((-1 < iVar5) && (((int)uVar4 < 0 || (*puVar16 <= auStack_c0[uVar4])))) {
              uVar4 = uVar15;
              uVar15 = uVar15 ^ 1;
            }
          }
          pfVar1 = local_70;
          pfVar3 = local_b0;
          pcVar10 = *(code **)((long)&Compressors[1].compress + lVar12);
          lVar12 = lVar12 + 0x10;
        } while (lVar12 != 0x30);
        if (-1 < (int)uVar4) {
          local_70->method = asStack_60[(ulong)uVar4 * 2];
          local_70->compressed_size = auStack_c0[uVar4];
        }
        aiStack_58[2] = 0x4034b50;
        local_48 = local_70->method;
        local_4c = 0x14;
        local_4a = (ushort)(local_48 == 8) * 2;
        local_46 = local_70->time;
        local_44 = local_70->date;
        local_42 = local_70->crc32;
        local_3a = local_70->uncompressed_size;
        local_3e = local_70->compressed_size;
        sVar8 = strlen(local_b0->path_in_zip);
        pFVar6 = local_90;
        local_36 = (undefined2)sVar8;
        local_34 = 0;
        lVar12 = ftell(local_90);
        pfVar1->zip_offset = (uint)lVar12;
        sVar8 = fwrite(aiStack_58 + 2,0x1e,1,pFVar6);
        if (sVar8 == 1) {
          pcVar14 = pfVar3->path_in_zip;
          sVar8 = strlen(pcVar14);
          sVar8 = fwrite(pcVar14,sVar8,1,pFVar6);
          uVar7 = local_78;
          if (sVar8 == 1) {
            if (pfVar1->method == 0) {
              sVar8 = fwrite(__ptr,1,local_78,pFVar6);
              if (sVar8 == uVar7) goto LAB_001041c7;
            }
            else {
              sVar8 = fwrite((void *)((long)aiStack_58[(int)uVar4] + (long)local_88[(int)uVar4]),1,
                             (ulong)auStack_c0[(int)uVar4],pFVar6);
              if (sVar8 == auStack_c0[(int)uVar4]) {
LAB_001041c7:
                free(__ptr);
                if (local_a0 != (void *)0x0) {
                  free(local_a0);
                }
                if (local_98 != (void *)0x0) {
                  free(local_98);
                }
                if (Quiet != 0) {
                  return 0;
                }
                uVar15 = pfVar1->compressed_size;
                uVar4 = pfVar1->uncompressed_size;
                pcVar14 = method_name((int)pfVar1->method);
                printf("%5.1f%% [%6u/%6u] %s\n",100.0 - ((double)uVar15 * 100.0) / (double)uVar4,
                       (ulong)uVar15,(ulong)uVar4,pcVar14);
                return 0;
              }
            }
          }
        }
        if (Quiet == 0) {
          putchar(10);
        }
        fprintf(_stderr,"Unable to write %s to zip\n",local_b8);
        free(__ptr);
        if (local_a0 != (void *)0x0) {
          free(local_a0);
        }
        if (local_98 == (void *)0x0) {
          return 1;
        }
        free(local_98);
        return 1;
      }
      free(__ptr);
      fprintf(_stderr,"Unable to read %s\n",local_b8);
    }
  }
  return 1;
}

Assistant:

int append_to_zip(FILE *zip_file, file_sorted_t *filep, FILE *ozip, BYTE *odir)
{
	LocalFileHeader local;
	uLong crc;
	file_entry_t *file;
	Byte *readbuf;
	Byte *compbuf[2];
	unsigned int comp_len[2];
	int offset[2];
	int method[2];
	int best;
	int slot;
	FILE *lumpfile;
	unsigned int readlen;
	unsigned int len;
	int i;
	struct tm *ltime;

	file = filep->file;

	// try to determine local time
	ltime = localtime(&file->time_write);
	time_to_dos(ltime, &file->date, &file->time);

	// lumpfile = source file
	lumpfile = fopen(file->path, "rb");
	if (lumpfile == NULL)
	{
		fprintf(stderr, "Could not open %s: %s\n", file->path, strerror(errno));
		return 1;
	}
	// len = source size
	fseek (lumpfile, 0, SEEK_END);
	len = ftell(lumpfile);
	fseek (lumpfile, 0, SEEK_SET);

	// allocate a buffer for the whole source file
	readbuf = malloc(len);
	if (readbuf == NULL)
	{
		fclose(lumpfile);
		fprintf(stderr, "Could not allocate %u bytes\n", (int)len);
		return 1;
	}
	// read the whole source file into buffer
	readlen = (unsigned int)fread(readbuf, 1, len, lumpfile);
	fclose(lumpfile);

	// if read less bytes than expected, 
	if (readlen != len)
	{
		// diagnose and return error
		free(readbuf);
		fprintf(stderr, "Unable to read %s\n", file->path);
		return 1;
	}
	// file loaded

	file->uncompressed_size = len;
	file->compressed_size = len;
	file->method = METHOD_STORED;

	// Calculate CRC32 for file.
	crc = crc32(0, NULL, 0);
	crc = crc32(crc, readbuf, (uInt)len);
	file->crc32 = LittleLong(crc);

	// Can we save time and just copy the file from the old zip?
	if (odir != NULL && ozip != NULL)
	{
		CentralDirectoryEntry *dirent;

		dirent = find_file_in_zip(odir, filep->path_in_zip, len, crc, file->date, file->time);
		if (dirent != NULL)
		{
			i = copy_zip_file(zip_file, file, ozip, dirent);
			if (i > 0)
			{
				free(readbuf);
				return 0;
			}
			if (i < 0)
			{
				free(readbuf);
				fprintf(stderr, "Unable to write %s to zip\n", file->path);
				return 1;
			}
		}
	}

	if (!Quiet)
	{
		if (ozip != NULL)
		{
			printf("Updating %-40s", filep->path_in_zip);
		}
		else
		{
			printf("Adding %-40s", filep->path_in_zip);
		}
	}
	UpdateCount++;

	// Allocate a buffer for compression, one byte less than the source buffer.
	// If it doesn't fit in that space, then skip compression and store it as-is.
	compbuf[0] = malloc(len - 1);
	compbuf[1] = malloc(len - 1);
	best = -1;	// best slot
	slot = 0;	// slot we are compressing to now

	// Find best compression method. We have two output buffers. One to hold the
	// best compression method, and the other to hold the compression we are trying
	// now.
	for (i = 0; Compressors[i].compress != NULL; ++i)
	{
		if (DeflateOnly && Compressors[i].method != METHOD_DEFLATE)
		{
			continue;
		}
		comp_len[slot] = len - 1;
		method[slot] = Compressors[i].method;
		offset[slot] = Compressors[i].compress(compbuf[slot], &comp_len[slot], readbuf, len);
		if (offset[slot] >= 0)
		{
			if (best < 0 || comp_len[slot] <= comp_len[best])
			{
				best = slot;
				slot ^= 1;
			}
		}
	}

	if (best >= 0)
	{
		file->method = method[best];
		file->compressed_size = comp_len[best];
	}
//	printf("%s -> method %d -> slot %d\n", filep->path_in_zip, file->method, best);

	// Fill in local directory header.
	local.Magic = ZIP_LOCALFILE;
	local.VersionToExtract[0] = method_to_version(file->method);
	local.VersionToExtract[1] = 0;
	local.Flags = file->method == METHOD_DEFLATE ? LittleShort(2) : 0;
	local.Method = LittleShort(file->method);
	local.ModTime = file->time;
	local.ModDate = file->date;
	local.CRC32 = file->crc32;
	local.UncompressedSize = LittleLong(file->uncompressed_size);
	local.CompressedSize = LittleLong(file->compressed_size);
	local.NameLength = LittleShort((unsigned short)strlen(filep->path_in_zip));
	local.ExtraLength = 0;

	file->zip_offset = ftell(zip_file);

	// Write out the header, file name, and file data.
	if (fwrite(&local, sizeof(local), 1, zip_file) != 1 ||
		fwrite(filep->path_in_zip, strlen(filep->path_in_zip), 1, zip_file) != 1 ||
		(file->method ? fwrite(compbuf[best] + offset[best], 1, comp_len[best], zip_file) != comp_len[best] :
						fwrite(readbuf, 1, len, zip_file) != len))
	{
		if (!Quiet)
		{
			printf("\n");
		}
		fprintf(stderr, "Unable to write %s to zip\n", file->path);
		free(readbuf);
		if (compbuf[0] != NULL)
		{
			free(compbuf[0]);
		}
		if (compbuf[1] != NULL)
		{
			free(compbuf[1]);
		}
		return 1;
	}

	// all done
	free(readbuf);
	if (compbuf[0] != NULL)
	{
		free(compbuf[0]);
	}
	if (compbuf[1] != NULL)
	{
		free(compbuf[1]);
	}
	if (!Quiet)
	{
		printf("%5.1f%% [%6u/%6u] %s\n", 100.0 - 100.0 * file->compressed_size / file->uncompressed_size,
			file->compressed_size, file->uncompressed_size, method_name(file->method));
	}
	return 0;
}